

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::trySetValidIndex(QComboBoxPrivate *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  QAbstractItemModel *pQVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 8);
  plVar3 = *(long **)(lVar2 + 0x298);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
  iVar6 = (**(code **)(*plVar3 + 0x78))(plVar3,(QModelIndex *)&local_58);
  if (0 < iVar6) {
    iVar7 = 0;
    bVar5 = false;
    do {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = this->model;
      iVar1 = this->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&this->root);
      (**(code **)(*(long *)pQVar4 + 0x60))((QModelIndex *)&local_58,pQVar4,iVar7,iVar1,&local_70);
      if (local_48.ptr == (QAbstractItemModel *)0x0) {
        bVar9 = true;
      }
      else {
        uVar8 = (**(code **)(*(long *)local_48.ptr + 0x138))(local_48.ptr,(QModelIndex *)&local_58);
        bVar9 = (uVar8 & 0x20) == 0;
      }
      if (!bVar9) {
        setCurrentIndex(this,(QModelIndex *)&local_58);
        bVar5 = true;
      }
      bVar10 = iVar6 + -1 != iVar7;
      iVar7 = iVar7 + 1;
    } while ((bool)(bVar9 & bVar10));
    if (bVar5) goto LAB_003da1c9;
  }
  local_58 = (undefined1 *)0xffffffffffffffff;
  puStack_50 = (undefined1 *)0x0;
  local_48.ptr = (QAbstractItemModel *)0x0;
  setCurrentIndex(this,(QModelIndex *)&local_58);
LAB_003da1c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::trySetValidIndex()
{
    Q_Q(QComboBox);
    bool currentReset = false;

    const int rowCount = q->count();
    for (int pos = 0; pos < rowCount; ++pos) {
        const QModelIndex idx(model->index(pos, modelColumn, root));
        if (idx.flags() & Qt::ItemIsEnabled) {
            setCurrentIndex(idx);
            currentReset = true;
            break;
        }
    }

    if (!currentReset)
        setCurrentIndex(QModelIndex());
}